

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zello_log.h
# Opt level: O0

undefined8 to_string_abi_cxx11_(ze_native_kernel_uuid_t uuid)

{
  ostream *poVar1;
  undefined8 uVar2;
  int local_1a8;
  int i;
  ostringstream local_198 [8];
  ostringstream result;
  undefined8 local_20;
  ze_native_kernel_uuid_t uuid_local;
  
  local_20 = uuid.id._8_8_;
  uVar2 = uuid.id._0_8_;
  uuid_local.id._8_8_ = uVar2;
  std::__cxx11::ostringstream::ostringstream(local_198);
  std::operator<<((ostream *)local_198,"{");
  for (local_1a8 = 0; local_1a8 < 0x10; local_1a8 = local_1a8 + 1) {
    poVar1 = std::operator<<((ostream *)local_198,"0x");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
    poVar1 = std::operator<<(poVar1,uuid_local.id[(long)local_1a8 + -8]);
    std::operator<<(poVar1,",");
  }
  std::operator<<((ostream *)local_198,"\b}");
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_198);
  uVar2._0_1_ = (uint8_t)uVar2;
  uVar2._1_1_ = SUB81(uVar2,1);
  uVar2._2_1_ = SUB81(uVar2,2);
  uVar2._3_1_ = SUB81(uVar2,3);
  uVar2._4_1_ = SUB81(uVar2,4);
  uVar2._5_1_ = SUB81(uVar2,5);
  uVar2._6_1_ = SUB81(uVar2,6);
  uVar2._7_1_ = SUB81(uVar2,7);
  return uVar2;
}

Assistant:

std::string to_string(const ze_native_kernel_uuid_t uuid) {
  std::ostringstream result;
  result << "{";
  for (int i = 0; i < ZE_MAX_NATIVE_KERNEL_UUID_SIZE; i++) {
    result << "0x" << std::hex << uuid.id[i] << ",";
  }
  result << "\b}";
  return result.str();
}